

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

void Ssw_ClassesPrintOne(Ssw_Cla_t *p,Aig_Obj_t *pRepr)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int level;
  Aig_Man_t *p_00;
  
  p_00 = (Aig_Man_t *)p;
  Abc_Print((int)p,"{ ");
  level = (int)p_00;
  lVar5 = (long)pRepr->Id;
  if (0 < p->pClassSizes[lVar5]) {
    lVar6 = 0;
    do {
      pObj = p->pId2Class[lVar5][lVar6];
      if (pObj != (Aig_Obj_t *)0x0) {
        uVar1 = pObj->Id;
        uVar2 = *(uint *)&pObj->field_0x1c;
        uVar3 = Aig_SupportSize(p->pAig,pObj);
        p_00 = p->pAig;
        uVar4 = Aig_NodeMffcSupp(p_00,pObj,0,(Vec_Ptr_t *)0x0);
        Abc_Print((int)p_00,"%d(%d,%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),(ulong)uVar3,
                  (ulong)uVar4);
      }
      level = (int)p_00;
      lVar6 = lVar6 + 1;
      lVar5 = (long)pRepr->Id;
    } while (lVar6 < p->pClassSizes[lVar5]);
  }
  Abc_Print(level,"}\n");
  return;
}

Assistant:

void Ssw_ClassesPrintOne( Ssw_Cla_t * p, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "{ " );
    Ssw_ClassForEachNode( p, pRepr, pObj, i )
        Abc_Print( 1, "%d(%d,%d,%d) ", pObj->Id, pObj->Level,
        Aig_SupportSize(p->pAig,pObj), Aig_NodeMffcSupp(p->pAig,pObj,0,NULL) );
    Abc_Print( 1, "}\n" );
}